

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gha.c
# Opt level: O1

int gha_adjust_info_newton_md(float *pcm,gha_info *info,size_t dim,gha_ctx_t ctx)

{
  double *pdVar1;
  gha_info *pgVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  long lVar7;
  size_t sVar8;
  undefined4 uVar9;
  double __x;
  int iVar10;
  ulong uVar11;
  float *pfVar12;
  gha_ctx_t pgVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  float *pfVar21;
  long *plVar22;
  size_t sVar23;
  size_t sVar24;
  long lVar25;
  size_t sVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  long local_188;
  long local_180;
  ulong local_178;
  size_t local_170;
  long local_168;
  long local_160;
  long local_158;
  float *local_150;
  size_t local_148;
  size_t local_140;
  ulong local_138;
  gha_info *local_130;
  long local_128;
  long local_120;
  undefined8 local_118;
  float *local_108;
  long local_100;
  undefined1 *local_f8;
  size_t local_f0;
  undefined1 local_e8 [16];
  float local_cc;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  float *local_a0;
  long local_98;
  long local_90;
  float *local_88;
  size_t local_80;
  size_t local_78;
  double local_70;
  long local_68;
  size_t local_60;
  float *local_58;
  gha_ctx_t local_50;
  long local_48;
  double *local_40;
  float *local_38;
  
  local_f0 = dim * 3;
  local_100 = dim * 3 + 1;
  local_48 = dim * 2;
  local_128 = dim * 8;
  local_140 = dim * 0x18;
  local_120 = dim << 4;
  local_88 = &info->magnitude;
  local_148 = local_100 * local_f0 * 8;
  local_138 = local_100 * local_f0 * 8 + 0xf & 0xfffffffffffffff0;
  local_158 = 0;
  plVar22 = &local_188;
  local_150 = pcm;
  local_130 = info;
  local_78 = dim;
  local_50 = ctx;
  while( true ) {
    pfVar21 = local_150;
    sVar23 = local_50->size;
    pfVar12 = local_50->tmp_buf;
    *(undefined8 *)((long)plVar22 + -8) = 0x101a7e;
    memcpy(pfVar12,pfVar21,sVar23 << 2);
    local_60 = local_50->size;
    local_a0 = (float *)((long)plVar22 + -(local_60 * dim * 4 + 0xf & 0xfffffffffffffff0));
    local_80 = local_50->size;
    uVar11 = local_80 * dim * 4 + 0xf & 0xfffffffffffffff0;
    lVar14 = (long)local_a0 - uVar11;
    pdVar15 = (double *)(lVar14 - uVar11);
    lVar16 = (long)pdVar15 - uVar11;
    lVar17 = lVar16 - uVar11;
    lVar18 = lVar17 - uVar11;
    lVar19 = lVar18 - uVar11;
    lVar20 = lVar19 - uVar11;
    uVar11 = local_50->size;
    local_f8 = (undefined1 *)plVar22;
    local_c8 = lVar16;
    local_c0 = lVar17;
    local_b8 = lVar18;
    local_b0 = lVar19;
    local_a8 = lVar20;
    local_98 = lVar14;
    local_90 = (long)pdVar15;
    if (uVar11 != 0) {
      local_168 = local_80 * 4;
      local_160 = local_60 * 4;
      uVar27 = 0;
      pgVar13 = local_50;
      lVar25 = lVar20;
      local_108 = local_a0;
      do {
        if (dim != 0) {
          if ((long)uVar27 < 1) {
            local_cc = (float)(long)-uVar27;
          }
          else {
            local_cc = (float)-uVar27;
          }
          lVar28 = 0;
          local_170 = local_78;
          local_38 = (float *)CONCAT44(local_38._4_4_,(float)uVar27);
          pfVar12 = local_108;
          pfVar21 = local_88;
          fVar31 = (float)uVar27;
          local_188 = lVar16;
          local_180 = lVar25;
          local_178 = uVar27;
          local_68 = lVar14;
          local_40 = pdVar15;
          do {
            local_e8 = ZEXT416((uint)*pfVar21);
            dVar6 = (double)(((gha_info *)(pfVar21 + -2))->frequency * fVar31 + pfVar21[-1]);
            local_70 = dVar6;
            local_58 = pfVar12;
            *(undefined8 *)(lVar20 + -8) = 0x101c79;
            dVar6 = sin(dVar6);
            __x = local_70;
            local_118 = (double *)CONCAT44((int)((ulong)dVar6 >> 0x20),(float)dVar6);
            *(undefined8 *)(lVar20 + -8) = 0x101c8e;
            dVar6 = cos(__x);
            pdVar15 = local_40;
            pgVar13 = local_50;
            pfVar12 = local_58;
            lVar14 = local_68;
            fVar3 = local_cc;
            lVar7 = local_160;
            lVar29 = local_168;
            uVar27 = local_178;
            lVar25 = local_180;
            lVar16 = local_188;
            uVar9 = local_e8._0_4_;
            fVar31 = (float)local_118;
            fVar32 = (float)local_e8._0_4_ * (float)local_118;
            local_50->tmp_buf[local_178] = local_50->tmp_buf[local_178] - fVar32;
            fVar30 = (float)dVar6;
            fVar33 = -(float)local_e8._0_4_;
            *local_58 = -(float)local_118;
            *(float *)(lVar14 + lVar28) = local_38._0_4_ * fVar33 * fVar30;
            *(float *)((long)pdVar15 + lVar28) = fVar33 * fVar30;
            *(float *)(lVar16 + lVar28) = fVar3 * fVar30;
            *(float *)(lVar17 + lVar28) = -fVar30;
            *(float *)(lVar18 + lVar28) = (float)uVar9 * local_38._0_4_ * local_38._0_4_ * fVar31;
            *(float *)(lVar19 + lVar28) = (float)uVar9 * local_38._0_4_ * fVar31;
            *(float *)(lVar25 + lVar28) = fVar32;
            lVar28 = lVar28 + lVar29;
            pfVar12 = (float *)((long)pfVar12 + lVar7);
            pfVar21 = pfVar21 + 3;
            local_170 = local_170 - 1;
            fVar31 = local_38._0_4_;
          } while (local_170 != 0);
        }
        uVar27 = uVar27 + 1;
        uVar11 = pgVar13->size;
        lVar25 = lVar25 + 4;
        lVar19 = lVar19 + 4;
        lVar18 = lVar18 + 4;
        lVar17 = lVar17 + 4;
        lVar16 = lVar16 + 4;
        pdVar15 = (double *)((long)pdVar15 + 4);
        lVar14 = lVar14 + 4;
        local_108 = local_108 + 1;
        dim = local_78;
      } while (uVar27 < uVar11);
    }
    sVar8 = local_148;
    local_e8._0_8_ = uVar11;
    pdVar15 = (double *)(lVar20 - local_138);
    local_40 = pdVar15;
    pdVar15[-1] = 5.21850415566421e-318;
    memset(pdVar15,0,sVar8);
    sVar23 = local_f0;
    sVar8 = local_140;
    if (dim != 0) {
      dVar6 = (double)(local_80 * 4);
      local_38 = local_a0;
      sVar24 = 0;
      lVar16 = local_98;
      lVar14 = local_90;
      do {
        lVar19 = sVar24 * local_100;
        lVar20 = (sVar24 + dim) * local_100;
        pdVar1 = local_40 + (local_48 + sVar24) * local_100;
        local_58 = local_a0;
        sVar26 = 0;
        lVar17 = local_98;
        lVar18 = local_90;
        do {
          if (local_e8._0_8_ != 0) {
            lVar25 = sVar26 + local_78;
            lVar28 = sVar26 + local_48;
            lVar29 = 0;
            do {
              if (sVar24 == sVar26) {
                fVar31 = local_38[lVar29];
                local_40[lVar19 + sVar26] = (double)(fVar31 * fVar31) + local_40[lVar19 + sVar26];
                fVar3 = local_50->tmp_buf[lVar29];
                fVar30 = *(float *)(lVar16 + lVar29 * 4);
                local_40[lVar19 + lVar25] =
                     (double)(*(float *)(local_c8 + lVar29 * 4) * fVar3 + fVar31 * fVar30) +
                     local_40[lVar19 + lVar25];
                fVar32 = *(float *)(lVar14 + lVar29 * 4);
                local_40[lVar19 + lVar28] =
                     (double)(*(float *)(local_c0 + lVar29 * 4) * fVar3 + fVar31 * fVar32) +
                     local_40[lVar19 + lVar28];
                local_40[lVar20 + lVar25] =
                     (double)(*(float *)(local_b8 + lVar29 * 4) * fVar3 + fVar30 * fVar30) +
                     local_40[lVar20 + lVar25];
                local_40[lVar20 + lVar28] =
                     (double)(*(float *)(local_b0 + lVar29 * 4) * fVar3 + fVar30 * fVar32) +
                     local_40[lVar20 + lVar28];
                fVar30 = fVar3 * *(float *)(local_a8 + lVar29 * 4) + fVar32 * fVar32;
              }
              else {
                fVar31 = local_38[lVar29];
                local_40[lVar19 + sVar26] =
                     (double)(local_58[lVar29] * fVar31) + local_40[lVar19 + sVar26];
                fVar3 = *(float *)(lVar17 + lVar29 * 4);
                local_40[lVar19 + lVar25] = (double)(fVar31 * fVar3) + local_40[lVar19 + lVar25];
                fVar30 = *(float *)(lVar18 + lVar29 * 4);
                local_40[lVar19 + lVar28] = (double)(fVar31 * fVar30) + local_40[lVar19 + lVar28];
                fVar31 = *(float *)(lVar16 + lVar29 * 4);
                local_40[lVar20 + lVar25] = (double)(fVar3 * fVar31) + local_40[lVar20 + lVar25];
                local_40[lVar20 + lVar28] = (double)(fVar31 * fVar30) + local_40[lVar20 + lVar28];
                fVar30 = fVar30 * *(float *)(lVar14 + lVar29 * 4);
              }
              pdVar1[lVar28] = (double)fVar30 + pdVar1[lVar28];
              lVar29 = lVar29 + 1;
            } while (local_e8._0_8_ != lVar29);
          }
          local_40[lVar19 + sVar26] = local_40[lVar19 + sVar26] + local_40[lVar19 + sVar26];
          lVar25 = sVar26 + local_78;
          local_40[lVar19 + lVar25] = local_40[lVar19 + lVar25] + local_40[lVar19 + lVar25];
          lVar28 = local_48 + sVar26;
          local_40[lVar19 + lVar28] = local_40[lVar19 + lVar28] + local_40[lVar19 + lVar28];
          local_40[lVar20 + lVar25] = local_40[lVar20 + lVar25] + local_40[lVar20 + lVar25];
          local_40[lVar20 + lVar28] = local_40[lVar20 + lVar28] + local_40[lVar20 + lVar28];
          pdVar1[lVar28] = pdVar1[lVar28] + pdVar1[lVar28];
          local_40[lVar19 + lVar25] = local_40[lVar20 + sVar26];
          local_40[lVar19 + lVar28] = pdVar1[sVar26];
          local_40[lVar20 + lVar28] = pdVar1[lVar25];
          sVar26 = sVar26 + 1;
          lVar18 = lVar18 + (long)dVar6;
          lVar17 = lVar17 + (long)dVar6;
          local_58 = local_58 + local_60;
        } while (sVar26 != local_78);
        sVar24 = sVar24 + 1;
        lVar14 = lVar14 + (long)dVar6;
        lVar16 = lVar16 + (long)dVar6;
        local_38 = local_38 + local_60;
        local_a8 = local_a8 + (long)dVar6;
        local_b0 = local_b0 + (long)dVar6;
        local_b8 = local_b8 + (long)dVar6;
        local_c0 = local_c0 + (long)dVar6;
        local_c8 = local_c8 + (long)dVar6;
        dim = local_78;
        local_118 = pdVar1;
        local_70 = dVar6;
        local_68 = local_60 * 4;
      } while (sVar24 != local_78);
    }
    sVar24 = local_60;
    if (dim != 0) {
      sVar26 = 0;
      lVar16 = local_90;
      lVar14 = local_98;
      pfVar12 = local_a0;
      do {
        if (local_e8._0_8_ != 0) {
          pfVar21 = local_50->tmp_buf;
          lVar17 = (sVar26 + dim) * local_100;
          lVar18 = (local_48 + sVar26) * local_100;
          lVar19 = 0;
          do {
            fVar31 = pfVar21[lVar19];
            local_40[local_f0 + sVar26 * local_100] =
                 (double)(pfVar12[lVar19] * fVar31) + local_40[local_f0 + sVar26 * local_100];
            fVar3 = *(float *)(lVar16 + lVar19 * 4);
            local_40[local_f0 + lVar17] =
                 (double)(*(float *)(lVar14 + lVar19 * 4) * fVar31) + local_40[local_f0 + lVar17];
            local_40[local_f0 + lVar18] = (double)(fVar31 * fVar3) + local_40[local_f0 + lVar18];
            lVar19 = lVar19 + 1;
          } while (local_e8._0_8_ != lVar19);
        }
        local_40[local_f0 + sVar26 * local_100] =
             local_40[local_f0 + sVar26 * local_100] + local_40[local_f0 + sVar26 * local_100];
        lVar17 = (sVar26 + dim) * local_100;
        local_40[local_f0 + lVar17] = local_40[local_f0 + lVar17] + local_40[local_f0 + lVar17];
        lVar17 = (local_48 + sVar26) * local_100;
        local_40[local_f0 + lVar17] = local_40[local_f0 + lVar17] + local_40[local_f0 + lVar17];
        sVar26 = sVar26 + 1;
        lVar16 = lVar16 + local_80 * 4;
        lVar14 = lVar14 + local_80 * 4;
        pfVar12 = pfVar12 + local_60;
        sVar24 = local_60 * 4;
      } while (sVar26 != dim);
    }
    local_60 = sVar24;
    pdVar15 = (double *)((long)pdVar15 - (local_f0 * 8 + 0xf & 0xfffffffffffffff0));
    pdVar15[-1] = 5.22473926411472e-318;
    memset(pdVar15,0,sVar8);
    pdVar1 = local_40;
    pdVar15[-1] = 5.2248133739616e-318;
    iVar10 = sle_solve(pdVar1,sVar23,pdVar15);
    if (iVar10 != 0) break;
    if (dim != 0) {
      sVar23 = 0;
      pfVar12 = local_88;
      do {
        *pfVar12 = (float)(pdVar15[sVar23] * -0.8 + (double)*pfVar12);
        uVar4 = ((gha_info *)(pfVar12 + -2))->frequency;
        uVar5 = ((gha_info *)(pfVar12 + -2))->phase;
        dVar6 = *(double *)((long)pdVar15 + sVar23 * 8 + local_120);
        ((gha_info *)(pfVar12 + -2))->frequency =
             (float)(*(double *)((long)pdVar15 + sVar23 * 8 + local_128) * -0.8 +
                    (double)(float)uVar4);
        ((gha_info *)(pfVar12 + -2))->phase = (float)(dVar6 * -0.8 + (double)(float)uVar5);
        sVar23 = sVar23 + 1;
        pfVar12 = pfVar12 + 3;
        sVar24 = dim;
        pfVar21 = local_88;
      } while (dim != sVar23);
      do {
        if (*pfVar21 < 0.0) {
          *pfVar21 = -*pfVar21;
          pfVar21[-1] = pfVar21[-1] + 3.1415927;
        }
        if (1.0 < *pfVar21) {
          *pfVar21 = 0.5;
        }
        sVar24 = sVar24 - 1;
        pfVar21 = pfVar21 + 3;
      } while (sVar24 != 0);
      sVar23 = 0;
      do {
        pgVar2 = local_130 + sVar23;
        if (pgVar2->frequency < 0.0) {
          pgVar2->frequency = -pgVar2->frequency;
          pgVar2->phase = 6.2831855 - pgVar2->phase;
        }
        fVar31 = pgVar2->frequency;
        if (6.2831855 < fVar31) {
          do {
            fVar31 = fVar31 + -6.2831855;
          } while (6.2831855 < fVar31);
          pgVar2->frequency = fVar31;
        }
        if (3.1415927 < fVar31) {
          pgVar2->frequency = 6.2831855 - fVar31;
        }
        sVar23 = sVar23 + 1;
      } while (sVar23 != dim);
      sVar23 = 0;
      do {
        pfVar12 = &local_130[sVar23].phase;
        fVar31 = *pfVar12;
        if (6.2831855 < fVar31) {
          do {
            fVar31 = fVar31 + -6.2831855;
          } while (6.2831855 < fVar31);
          *pfVar12 = fVar31;
        }
        fVar31 = *pfVar12;
        if (fVar31 < 0.0) {
          do {
            fVar31 = fVar31 + 6.2831855;
          } while (fVar31 < 0.0);
          *pfVar12 = fVar31;
        }
        sVar23 = sVar23 + 1;
      } while (sVar23 != dim);
    }
    local_158 = local_158 + 1;
    plVar22 = (long *)local_f8;
    if (local_158 == 7) {
      return 0;
    }
  }
  return -1;
}

Assistant:

int gha_adjust_info_newton_md(const FLOAT* pcm, struct gha_info* info, size_t dim, gha_ctx_t ctx)
{
	size_t loop;
	size_t i, j, k, n;

	const size_t MAX_LOOPS = 7;

	for (loop = 0; loop < MAX_LOOPS; loop++) {
		memcpy(ctx->tmp_buf, pcm, ctx->size * sizeof(FLOAT));

		// Use VLA for a while
		FLOAT BA[dim][ctx->size];
		FLOAT Bw[dim][ctx->size];
		FLOAT Bp[dim][ctx->size];
		FLOAT BAw[dim][ctx->size];
		FLOAT BAp[dim][ctx->size];
		FLOAT Bww[dim][ctx->size];
		FLOAT Bwp[dim][ctx->size];
		FLOAT Bpp[dim][ctx->size];

		for (n = 0; n < ctx->size; n++) {
			for (k = 0; k < dim; k++) {
				FLOAT Ak = (info+k)->magnitude;
				FLOAT wk = (info+k)->frequency;
				FLOAT pk = (info+k)->phase;
				FLOAT s = sin(wk * n + pk);
				FLOAT c = cos(wk * n + pk);
				ctx->tmp_buf[n] -= Ak * s;

				BA[k][n] = -s;
				Bw[k][n] = -Ak * n * c;
				Bp[k][n] = -Ak * c;

				BAw[k][n] = -n * c;
				BAp[k][n] = -c;
				Bww[k][n] = Ak * n * n * s;
				Bwp[k][n] = Ak * n * s;
				Bpp[k][n] = Ak * s;

			}
		}

		double M[dim * 3][dim * 3 + 1];
		memset(M, '\0', dim * 3 * (dim * 3 + 1) * sizeof(double));
		for (i = 0; i < dim; i++) {
			for (j = 0; j < dim; j++) {
				for (n = 0; n < ctx->size; n++) {
					if (i == j) {
						M[i + dim * 0][j + dim * 0] += BA[i][n] * BA[i][n];
						M[i + dim * 0][j + dim * 1] += ctx->tmp_buf[n] * BAw[i][n] + BA[i][n] * Bw[i][n];
						M[i + dim * 0][j + dim * 2] += ctx->tmp_buf[n] * BAp[i][n] + BA[i][n] * Bp[i][n];

						M[i + dim * 1][j + dim * 1] += ctx->tmp_buf[n] * Bww[i][n] + Bw[i][n] * Bw[i][n];
						M[i + dim * 1][j + dim * 2] += ctx->tmp_buf[n] * Bwp[i][n] + Bw[i][n] * Bp[i][n];

						M[i + dim * 2][j + dim * 2] += ctx->tmp_buf[n] * Bpp[i][n] + Bp[i][n] * Bp[i][n];
					} else {
						M[i + dim * 0][j + dim * 0] += BA[i][n] * BA[j][n];
						M[i + dim * 0][j + dim * 1] += BA[i][n] * Bw[j][n];
						M[i + dim * 0][j + dim * 2] += BA[i][n] * Bp[j][n];

						M[i + dim * 1][j + dim * 1] += Bw[i][n] * Bw[j][n];
						M[i + dim * 1][j + dim * 2] += Bw[i][n] * Bp[j][n];

						M[i + dim * 2][j + dim * 2] += Bp[i][n] * Bp[j][n];
					}
				}
				M[i + dim * 0][j + dim * 0] *= 2;
				M[i + dim * 0][j + dim * 1] *= 2;
				M[i + dim * 0][j + dim * 2] *= 2;

				M[i + dim * 1][j + dim * 1] *= 2;
				M[i + dim * 1][j + dim * 2] *= 2;

				M[i + dim * 2][j + dim * 2] *= 2;


				M[i + dim * 0][j + dim * 1] = M[i + dim * 1][j + dim * 0];
				M[i + dim * 0][j + dim * 2] = M[i + dim * 2][j + dim * 0];
				M[i + dim * 1][j + dim * 2] = M[i + dim * 2][j + dim * 1];
			}
		}

		for (k = 0; k < dim; k++) {
			for (n = 0; n < ctx->size; n++) {
				M[k + dim * 0][dim * 3] += ctx->tmp_buf[n] * BA[k][n];
				M[k + dim * 1][dim * 3] += ctx->tmp_buf[n] * Bw[k][n];
				M[k + dim * 2][dim * 3] += ctx->tmp_buf[n] * Bp[k][n];
			}
			M[k + dim * 0][dim * 3] *= 2;
			M[k + dim * 1][dim * 3] *= 2;
			M[k + dim * 2][dim * 3] *= 2;
		}

		double fx0[dim * 3];
		memset(fx0, '\0', dim * 3 * sizeof(double));
		if(sle_solve(&M[0][0], dim * 3, fx0)) {
			return -1;
		}

		for (k = 0; k < dim; k++) {
			//fprintf(stderr, "delta1: %f\n", fx0[k + dim * 0]);
			//fprintf(stderr, "delta2: %f\n", fx0[k + dim * 1]);
			//fprintf(stderr, "delta3: %f\n", fx0[k + dim * 2]);
			(info+k)->magnitude -= (fx0[k + dim * 0] * 0.8);
			(info+k)->frequency -= (fx0[k + dim * 1] * 0.8);
			(info+k)->phase -=     (fx0[k + dim * 2] * 0.8);
		}

		for (k = 0; k < dim; k++) {
			if ((info+k)->magnitude < 0) {
				(info+k)->magnitude *= -1;
				(info+k)->phase += M_PI;
			}

			if ((info+k)->magnitude > 1) {
				//TODO: ???
				(info+k)->magnitude = 0.5;
			}
		}

		for (k = 0; k < dim; k++) {
			if ((info + k)->frequency < 0) {
				//fprintf(stderr, "negative freq\n");
				(info + k)->frequency *= -1;
				(info + k)->phase = 2 * M_PI - (info + k)->phase;
			}
			while ((info + k)->frequency > M_PI * 2.0) {
				//fprintf(stderr, "freq over\n");
				(info + k)->frequency -= M_PI * 2.0;
			}
			if ((info + k)->frequency > M_PI) {
				//fprintf(stderr, "freq ??\n");
				(info + k)->frequency = 2 * M_PI - (info + k)->frequency;
			}
		}

		for (k = 0; k < dim; k++) {
			while ((info+k)->phase > M_PI * 2.0) {
				(info+k)->phase -= M_PI * 2;
			}
			while ((info + k)->phase < 0) {
				(info+k)->phase += M_PI * 2;
			}
		}
	}
	return 0;
}